

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManDfsForCrossCut(Gia_Man_t *p,int fReverse)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  Vec_Int_t *vNodes;
  int *piVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  auVar5 = _DAT_008403e0;
  iVar1 = p->nObjs;
  if (0 < (long)iVar1) {
    pGVar3 = p->pObjs;
    lVar8 = (long)iVar1 + -1;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar10 = auVar10 ^ _DAT_008403e0;
    auVar12 = _DAT_008403c0;
    auVar14 = _DAT_008403d0;
    do {
      auVar15 = auVar14 ^ auVar5;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                  iVar11 < auVar15._4_4_) & 1)) {
        *(undefined4 *)((long)&pGVar3->Value + lVar8) = 0;
      }
      if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
          auVar15._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)&pGVar3[1].Value + lVar8) = 0;
      }
      auVar15 = auVar12 ^ auVar5;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar11 && (iVar16 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)&pGVar3[2].Value + lVar8) = 0;
        *(undefined4 *)((long)&pGVar3[3].Value + lVar8) = 0;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      lVar8 = lVar8 + 0x30;
    } while ((ulong)(iVar1 + 3U >> 2) * 0x30 != lVar8);
  }
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar11 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar11;
  if (iVar11 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar11 << 2);
  }
  vNodes->pArray = piVar6;
  Gia_ManIncrementTravId(p);
  pVVar7 = p->vCos;
  uVar2 = pVVar7->nSize;
  uVar9 = (ulong)uVar2;
  if (fReverse == 0) {
    if (0 < (int)uVar2) {
      lVar8 = 0;
      do {
        iVar1 = pVVar7->pArray[lVar8];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_007901bb;
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return vNodes;
        }
        pGVar3 = p->pObjs + iVar1;
        if ((~*(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) &
            0x1fffffff1fffffff) != 0) {
          Gia_ManDfsForCrossCut_rec(p,pGVar3,vNodes);
          pVVar7 = p->vCos;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar7->nSize);
    }
  }
  else if (0 < (int)uVar2) {
    do {
      if ((long)p->vCos->nSize < (long)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar9 - 1];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_007901bb:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return vNodes;
      }
      pGVar3 = p->pObjs + iVar1;
      if ((~*(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) &
          0x1fffffff1fffffff) != 0) {
        Gia_ManDfsForCrossCut_rec(p,pGVar3,vNodes);
      }
      bVar4 = 1 < uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar4);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManDfsForCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanValue( p );
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    if ( fReverse )
    {
        Gia_ManForEachCoReverse( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
                Gia_ManDfsForCrossCut_rec( p, pObj, vNodes );
    }
    return vNodes;
}